

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc2.c
# Opt level: O2

void OP_gcscan2(void)

{
  uint uVar1;
  
  if ((MachineState.tosvalue & 0xfff0000) == 0xe0000) {
    uVar1 = gcscan2(MachineState.tosvalue & 0xffff);
    MachineState.tosvalue = 0;
    if (uVar1 != 0xffffffff) {
      MachineState.tosvalue = uVar1 | 0xe0000;
    }
  }
  MachineState.currentpc = MachineState.currentpc + 1;
  return;
}

Assistant:

void OP_gcscan2(void) {
  int scan;
#ifdef TRACE
  printPC();
  printf("TRACE: OP_gcscan2()\n");
#endif
  if ((TopOfStack & SEGMASK) == S_POSITIVE) {
    scan = gcscan2(LOLOC(TopOfStack));
    TopOfStack = (scan == -1) ? NIL : scan | S_POSITIVE;
  }
  PC++;
}